

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

uint8_t __thiscall Lexer::nc(Lexer *this)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  Lexer *this_local;
  
  (this->current_index).col = (this->current_index).col + 1;
  uVar1 = gc(this);
  if (uVar1 == '\r') {
    (this->current_index).col = 0;
    (this->current_index).row = (this->current_index).row + 1;
    (this->current_index).index = (this->current_index).index + 1;
    uVar1 = gc(this);
    if (uVar1 != '\n') {
      uVar1 = gc(this);
      return uVar1;
    }
  }
  (this->current_index).index = (this->current_index).index + 1;
  puVar2 = (uint8_t *)std::__cxx11::string::operator[]((ulong)this);
  return *puVar2;
}

Assistant:

uint8_t Lexer::nc() {
    current_index.col++;
    if (gc() == '\r') {
        current_index.col = 0;
        current_index.row++;
        current_index.index++;
        if (gc() != '\n')return gc();
    }
    return code_ptr[current_index.index++];
}